

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseUnaryExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t sVar4;
  char *pcVar5;
  size_t sVar6;
  
  startIndex = state->tokenPosition;
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  switch(iVar1) {
  case 0x1a:
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 != 0x1a) {
LAB_0012e2a1:
      sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
      pcVar5 = "Expected a quote token.";
      goto LAB_0012e65e;
    }
    sVar6 = state->tokenPosition;
    state->tokenPosition = sVar6 + 1;
    sVar2 = sysbvm_parser_parsePrimaryTerm(context,state);
    sVar3 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,sVar6,state->tokenPosition);
    sVar2 = sysbvm_astQuoteNode_create(context,sVar3,sVar2);
    break;
  case 0x1b:
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 != 0x1b) goto LAB_0012e2a1;
    sVar6 = state->tokenPosition;
    state->tokenPosition = sVar6 + 1;
    sVar2 = sysbvm_parser_parsePrimaryTerm(context,state);
    sVar3 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,sVar6,state->tokenPosition);
    sVar2 = sysbvm_astQuasiQuoteNode_create(context,sVar3,sVar2);
    break;
  case 0x1c:
    sVar2 = sysbvm_parser_parseQuasiUnquote(context,state);
    break;
  case 0x1d:
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 != 0x1d) goto LAB_0012e2a1;
    sVar6 = state->tokenPosition;
    state->tokenPosition = sVar6 + 1;
    sVar2 = sysbvm_parser_parsePrimaryTerm(context,state);
    sVar3 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,sVar6,state->tokenPosition);
    sVar2 = sysbvm_astSpliceNode_create(context,sVar3,sVar2);
    break;
  default:
    sVar2 = sysbvm_parser_parsePrimaryTerm(context,state);
  }
LAB_0012e2c9:
  do {
    while (iVar1 = sysbvm_parser_lookKindAt(state,0), 0xc < iVar1) {
      if (iVar1 < 0x1e) {
        if (iVar1 != 0xd) {
          if (iVar1 != 0x1c) {
            return sVar2;
          }
          sVar3 = sysbvm_parser_parseQuasiUnquote(context,state);
          goto LAB_0012e584;
        }
        sVar3 = sysbvm_parser_parseBlockExpression(context,state);
        sourcePosition =
             sysbvm_parser_makeSourcePositionForTokenRange
                       (context,state->sourceCode,state->tokenSequence,startIndex,
                        state->tokenPosition);
        pcVar5 = "{}:";
      }
      else if (iVar1 == 0x1e) {
        sVar3 = sysbvm_parser_parseByteArrayExpression(context,state);
        sourcePosition =
             sysbvm_parser_makeSourcePositionForTokenRange
                       (context,state->sourceCode,state->tokenSequence,startIndex,
                        state->tokenPosition);
        pcVar5 = "#[]:";
      }
      else {
        if (iVar1 != 0x1f) {
          return sVar2;
        }
        sVar3 = sysbvm_parser_parseDictionaryExpression(context,state);
        sourcePosition =
             sysbvm_parser_makeSourcePositionForTokenRange
                       (context,state->sourceCode,state->tokenSequence,startIndex,
                        state->tokenPosition);
        pcVar5 = "#{}:";
      }
      sVar4 = sysbvm_symbol_internWithCString(context,pcVar5);
      sVar4 = sysbvm_astLiteralNode_create(context,sourcePosition,sVar4);
LAB_0012e4a3:
      sVar2 = sysbvm_parser_makeBinaryMessageSend(context,sourcePosition,sVar2,sVar4,sVar3);
    }
    if (iVar1 == 2) {
      sVar3 = sysbvm_parser_parseLiteralTokenValue(context,state);
LAB_0012e584:
      sourcePosition =
           sysbvm_parser_makeSourcePositionForTokenRange
                     (context,state->sourceCode,state->tokenSequence,startIndex,state->tokenPosition
                     );
      sVar4 = sysbvm_array_create(context,0);
LAB_0012e5b6:
      sVar2 = sysbvm_astMessageSendNode_create(context,sourcePosition,sVar2,sVar3,sVar4);
      goto LAB_0012e2c9;
    }
    if (iVar1 == 9) {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 != 9) {
        sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        pcVar5 = "Expected a left parenthesis.";
        goto LAB_0012e65e;
      }
      state->tokenPosition = state->tokenPosition + 1;
      sVar3 = sysbvm_orderedCollection_create(context);
      sysbvm_orderedCollection_add(context,sVar3,sVar2);
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if ((-1 < iVar1) && (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 != 10)) {
        while( true ) {
          sVar2 = sysbvm_parser_parseAssignmentExpression(context,state);
          sysbvm_orderedCollection_add(context,sVar3,sVar2);
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          if (iVar1 != 0x17) break;
          state->tokenPosition = state->tokenPosition + 1;
        }
      }
      sVar2 = sysbvm_orderedCollection_asArray(context,sVar3);
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 != 10) {
        sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        pcVar5 = "Expected a right parenthesis.";
        goto LAB_0012e65e;
      }
      sVar6 = state->tokenPosition + 1;
      state->tokenPosition = sVar6;
      sVar3 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,startIndex,sVar6);
      sVar2 = sysbvm_astUnexpandedSExpressionNode_create(context,sVar3,sVar2);
    }
    else {
      if (iVar1 != 0xb) {
        return sVar2;
      }
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 == 0xb) {
        state->tokenPosition = state->tokenPosition + 1;
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        sVar3 = 0;
        if (-1 < iVar1) {
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          sVar3 = 0;
          if (iVar1 != 0xc) {
            sVar3 = sysbvm_parser_parseCommaExpression(context,state);
          }
        }
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        if (iVar1 == 0xc) {
          sVar6 = state->tokenPosition + 1;
          state->tokenPosition = sVar6;
          sourcePosition =
               sysbvm_parser_makeSourcePositionForTokenRange
                         (context,state->sourceCode,state->tokenSequence,startIndex,sVar6);
          if (sVar3 != 0) {
            sVar4 = sysbvm_symbol_internWithCString(context,"[]:");
            sVar4 = sysbvm_astLiteralNode_create(context,sourcePosition,sVar4);
            goto LAB_0012e4a3;
          }
          sVar3 = sysbvm_symbol_internWithCString(context,"[]");
          sVar3 = sysbvm_astLiteralNode_create(context,sourcePosition,sVar3);
          sVar4 = sysbvm_array_create(context,0);
          goto LAB_0012e5b6;
        }
        sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        pcVar5 = "Expected a subscript right bracket.";
      }
      else {
        sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        pcVar5 = "Expected a subscript left bracket.";
      }
LAB_0012e65e:
      sVar2 = sysbvm_astErrorNode_createWithCString(context,sVar2,pcVar5);
    }
  } while( true );
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseUnaryExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    size_t startPosition = state->tokenPosition;

    sysbvm_tuple_t receiver = sysbvm_parser_parsePrimaryExpression(context, state);
    bool attemptToContinue = true;
    while(attemptToContinue)
    {
        switch(sysbvm_parser_lookKindAt(state, 0))
        {
        case SYSBVM_TOKEN_KIND_IDENTIFIER:
            {
                sysbvm_tuple_t selector = sysbvm_parser_parseLiteralTokenValue(context, state);
                size_t endPosition = state->tokenPosition;

                receiver = sysbvm_parser_makeUnaryMessageSend(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), receiver, selector);
            }
            break;
        case SYSBVM_TOKEN_KIND_QUASI_UNQUOTE:
            {
                sysbvm_tuple_t selector = sysbvm_parser_parseQuasiUnquote(context, state);
                size_t endPosition = state->tokenPosition;

                receiver = sysbvm_parser_makeUnaryMessageSend(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), receiver, selector);
            }
            break;
        case SYSBVM_TOKEN_KIND_LPARENT:
            receiver = sysbvm_parser_parseCallExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_LCBRACKET:
            receiver = sysbvm_parser_parseApplyBlockExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_LBRACKET:
            receiver = sysbvm_parser_parseSubscriptExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_BYTE_ARRAY_START:
            receiver = sysbvm_parser_parseApplyByteArrayExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_DICTIONARY_START:
            receiver = sysbvm_parser_parseApplyDictionaryWithReceiver(context, state, receiver, startPosition);
            break;
        default:
            attemptToContinue = false;
            break;
        }
    }

    return receiver;
}